

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_scalar_reference_finite_element.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
projects::dpg::TraceScalarReferenceFiniteElement<double>::GradientsReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          TraceScalarReferenceFiniteElement<double> *this,MatrixXd *local)

{
  bool bVar1;
  uint n;
  element_type *peVar2;
  Matrix<double,__1,__1,_0,__1,__1> local_2f0;
  Type local_2d8;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  MatrixXd *local_20;
  MatrixXd *local_local;
  TraceScalarReferenceFiniteElement<double> *this_local;
  
  local_20 = local;
  local_local = (MatrixXd *)this;
  this_local = (TraceScalarReferenceFiniteElement<double> *)__return_storage_ptr__;
  bVar1 = isInitialized(this);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Not initialized");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"isInitialized()",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../trace_scalar_reference_finite_element.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x6c,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../trace_scalar_reference_finite_element.h"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
    lf::base::AssertionFailed(&local_248,&local_270,0x6c,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  peVar2 = std::
           __shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->cfe_);
  (*peVar2->_vptr_ScalarReferenceFiniteElement[8])(&local_2f0,peVar2,local_20);
  n = (*(this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement[4])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::topRows<unsigned_int>
            (&local_2d8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_2f0,n);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             &local_2d8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2f0);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  GradientsReferenceShapeFunctions(
      const Eigen::MatrixXd& local) const override {
    LF_ASSERT_MSG(isInitialized(), "Not initialized");
    return cfe_->GradientsReferenceShapeFunctions(local).topRows(
        NumRefShapeFunctions());
  }